

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIEnvironment::CGUIEnvironment
          (CGUIEnvironment *this,IFileSystem *fs,IVideoDriver *driver,IOSOperator *op)

{
  int iVar1;
  dimension2d<unsigned_int> *other;
  undefined4 extraout_var;
  IGUIElement *in_RCX;
  long *in_RDX;
  rect<int> *in_RSI;
  IGUIEnvironment *in_RDI;
  CGUIEnvironment *unaff_retaddr;
  IGUISkin *skin;
  dimension2d<int> *in_stack_ffffffffffffff98;
  IReferenceCounted *this_00;
  array<irr::gui::CGUIEnvironment::SFont> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb8;
  s32 id;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  dimension2d<int> in_stack_ffffffffffffffc8;
  EGUI_ELEMENT_TYPE in_stack_ffffffffffffffd4;
  void **in_stack_ffffffffffffffd8;
  
  id = (s32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[0x10].field_0x8);
  IGUIEnvironment::IGUIEnvironment(in_RDI,&PTR_construction_vtable_24__00445f28);
  if (in_RDX == (long *)0x0) {
    in_stack_ffffffffffffffc4 = 0;
    in_stack_ffffffffffffffc0 = 0;
    core::dimension2d<int>::dimension2d
              ((dimension2d<int> *)&stack0xffffffffffffffc8,(int *)&stack0xffffffffffffffc4,
               (int *)&stack0xffffffffffffffc0);
  }
  else {
    other = (dimension2d<unsigned_int> *)(**(code **)(*in_RDX + 0x1d8))();
    core::dimension2d<int>::dimension2d<unsigned_int>
              ((dimension2d<int> *)&stack0xffffffffffffffc8,other);
  }
  core::rect<int>::rect<int>((rect<int> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (IReferenceCounted *)&stack0xffffffffffffffd0;
  IGUIElement::IGUIElement
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
             (IGUIEnvironment *)in_stack_ffffffffffffffc8,
             (IGUIElement *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),id,in_RSI)
  ;
  in_RDI->_vptr_IGUIEnvironment = (_func_int **)0x445c68;
  *(undefined8 *)&in_RDI[0x10].field_0x8 = 0x445f10;
  *(undefined8 *)&in_RDI->field_0x8 = 0x445dd8;
  core::array<irr::gui::CGUIEnvironment::SFont>::array(in_stack_ffffffffffffffa0);
  core::array<irr::gui::CGUIEnvironment::SSpriteBank>::array
            ((array<irr::gui::CGUIEnvironment::SSpriteBank> *)in_stack_ffffffffffffffa0);
  *(long **)&in_RDI[0xc].field_0x18 = in_RDX;
  in_RDI[0xd]._vptr_IGUIEnvironment = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[0xd].field_0x8 = 0;
  *(undefined8 *)&in_RDI[0xd].field_0x10 = 0;
  core::vector2d<int>::vector2d((vector2d<int> *)&in_RDI[0xd].field_0x18,0,0);
  in_RDI[0xe]._vptr_IGUIEnvironment = (_func_int **)0x0;
  *(rect<int> **)&in_RDI[0xe].field_0x8 = in_RSI;
  *(undefined8 *)&in_RDI[0xe].field_0x10 = 0;
  *(IGUIElement **)&in_RDI[0xe].field_0x18 = in_RCX;
  *(undefined4 *)&in_RDI[0xf]._vptr_IGUIEnvironment = 9;
  core::array<irr::gui::IGUIElement_*>::array
            ((array<irr::gui::IGUIElement_*> *)in_stack_ffffffffffffffa0);
  if (*(long *)&in_RDI[0xc].field_0x18 != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI[0xc].field_0x18 +
               *(long *)(**(long **)&in_RDI[0xc].field_0x18 + -0x18)));
  }
  if (*(long *)&in_RDI[0xe].field_0x8 != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI[0xe].field_0x8 +
               *(long *)(**(long **)&in_RDI[0xe].field_0x8 + -0x18)));
  }
  if (*(long *)&in_RDI[0xe].field_0x18 != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI[0xe].field_0x18 +
               *(long *)(**(long **)&in_RDI[0xe].field_0x18 + -0x18)));
  }
  loadBuiltInFont(unaff_retaddr);
  iVar1 = (*in_RDI->_vptr_IGUIEnvironment[0xe])(in_RDI,1);
  (*in_RDI->_vptr_IGUIEnvironment[0xd])(in_RDI,CONCAT44(extraout_var,iVar1));
  IReferenceCounted::drop(this_00);
  *(undefined4 *)&in_RDI[10].field_0x8 = 0;
  *(undefined4 *)&in_RDI[10].field_0xc = 0;
  *(undefined4 *)&in_RDI[10].field_0x10 = 1000;
  *(undefined4 *)&in_RDI[10].field_0x14 = 500;
  in_RDI[10]._vptr_IGUIEnvironment = (_func_int **)0x0;
  *(IGUIEnvironment **)&in_RDI[9].field_0x10 = in_RDI;
  IGUIElement::setTabGroup((IGUIElement *)&in_RDI->field_0x8,true);
  return;
}

Assistant:

CGUIEnvironment::CGUIEnvironment(io::IFileSystem *fs, video::IVideoDriver *driver, IOSOperator *op) :
		IGUIElement(EGUIET_ROOT, 0, 0, 0, core::rect<s32>(driver ? core::dimension2d<s32>(driver->getScreenSize()) : core::dimension2d<s32>(0, 0))),
		Driver(driver), Hovered(0), HoveredNoSubelement(0), Focus(0), LastHoveredMousePos(0, 0), CurrentSkin(0),
		FileSystem(fs), UserReceiver(0), Operator(op), FocusFlags(EFF_SET_ON_LMOUSE_DOWN | EFF_SET_ON_TAB)
{
	if (Driver)
		Driver->grab();

	if (FileSystem)
		FileSystem->grab();

	if (Operator)
		Operator->grab();

#ifdef _DEBUG
	IGUIEnvironment::setDebugName("CGUIEnvironment");
#endif

	loadBuiltInFont();

	IGUISkin *skin = createSkin(gui::EGST_WINDOWS_METALLIC);
	setSkin(skin);
	skin->drop();

	// set tooltip default
	ToolTip.LastTime = 0;
	ToolTip.EnterTime = 0;
	ToolTip.LaunchTime = 1000;
	ToolTip.RelaunchTime = 500;
	ToolTip.Element = 0;

	// environment is root tab group
	Environment = this;
	setTabGroup(true);
}